

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt64(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this,int64_t i64)

{
  uint64_t u;
  char *pcVar1;
  char *pcVar2;
  char buffer [21];
  char local_38;
  char local_37 [31];
  
  pcVar1 = &local_38;
  pcVar2 = &local_38;
  if (i64 < 0) {
    pcVar1 = local_37;
    local_38 = '-';
    i64 = -i64;
  }
  pcVar1 = internal::u64toa(i64,pcVar1);
  for (; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    std::ostream::put((char)this->os_->stream_);
  }
  return true;
}

Assistant:

bool WriteInt64(int64_t i64) {
        char buffer[21];
        const char* end = internal::i64toa(i64, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }